

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,double,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool>
               (interval_t *ldata,double *rdata,interval_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  undefined4 uVar6;
  unsigned_long *puVar5;
  undefined4 uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  ulong uVar11;
  TemplatedValidityData<unsigned_long> *pTVar12;
  _Head_base<0UL,_unsigned_long_*,_false> _Var13;
  ulong uVar14;
  idx_t idx_in_entry;
  ulong uVar15;
  int64_t *piVar16;
  interval_t iVar17;
  interval_t left;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_40;
  idx_t local_38;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    if (count != 0) {
      psVar3 = lsel->sel_vector;
      psVar4 = rsel->sel_vector;
      piVar16 = &result_data->micros;
      uVar15 = 0;
      do {
        uVar11 = uVar15;
        if (psVar3 != (sel_t *)0x0) {
          uVar11 = (ulong)psVar3[uVar15];
        }
        uVar14 = uVar15;
        if (psVar4 != (sel_t *)0x0) {
          uVar14 = (ulong)psVar4[uVar15];
        }
        uVar1 = ldata[uVar11].months;
        uVar6 = ldata[uVar11].days;
        left.days = uVar6;
        left.months = uVar1;
        left.micros = ldata[uVar11].micros;
        iVar17 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                           (left,rdata[uVar14]);
        ((interval_t *)(piVar16 + -1))->months = (int)iVar17._0_8_;
        ((interval_t *)(piVar16 + -1))->days = (int)((ulong)iVar17._0_8_ >> 0x20);
        *piVar16 = iVar17.micros;
        uVar15 = uVar15 + 1;
        piVar16 = piVar16 + 2;
      } while (count != uVar15);
    }
  }
  else if (count != 0) {
    psVar3 = lsel->sel_vector;
    psVar4 = rsel->sel_vector;
    local_40 = &(result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data;
    piVar16 = &result_data->micros;
    uVar15 = 0;
    do {
      uVar11 = uVar15;
      if (psVar3 != (sel_t *)0x0) {
        uVar11 = (ulong)psVar3[uVar15];
      }
      uVar14 = uVar15;
      if (psVar4 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar4[uVar15];
      }
      puVar5 = (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) != 0))
         && ((puVar5 = (rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask,
             puVar5 == (unsigned_long *)0x0 || ((puVar5[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)))
         ) {
        uVar2 = ldata[uVar11].months;
        uVar7 = ldata[uVar11].days;
        iVar17.days = uVar7;
        iVar17.months = uVar2;
        iVar17.micros = ldata[uVar11].micros;
        iVar17 = MultiplyOperator::Operation<duckdb::interval_t,double,duckdb::interval_t>
                           (iVar17,rdata[uVar14]);
        ((interval_t *)(piVar16 + -1))->months = (int)iVar17._0_8_;
        ((interval_t *)(piVar16 + -1))->days = (int)((ulong)iVar17._0_8_ >> 0x20);
        *piVar16 = iVar17.micros;
      }
      else {
        _Var13._M_head_impl =
             (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var13._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (result_validity->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_58,&local_38);
          p_Var10 = p_Stack_50;
          peVar9 = local_58;
          local_58 = (element_type *)0x0;
          p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar9;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var10;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
          pTVar12 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_40);
          _Var13._M_head_impl =
               (pTVar12->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (result_validity->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               _Var13._M_head_impl;
        }
        bVar8 = (byte)uVar15 & 0x3f;
        _Var13._M_head_impl[uVar15 >> 6] =
             _Var13._M_head_impl[uVar15 >> 6] & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8)
        ;
      }
      uVar15 = uVar15 + 1;
      piVar16 = piVar16 + 2;
    } while (count != uVar15);
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}